

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void empty_closedir_cb(uv_fs_t *req)

{
  int iVar1;
  ssize_t *psVar2;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_8;
  
  if (req == &closedir_req) {
    local_8 = (ssize_t)closedir_req.fs_type;
    if (local_8 == 0x21) {
      local_8 = closedir_req.result;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0018c972;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0018c972:
  psVar2 = &local_8;
  empty_closedir_cb_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(psVar2,0);
  return;
}

Assistant:

static void empty_closedir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &closedir_req);
  ASSERT_EQ(req->fs_type, UV_FS_CLOSEDIR);
  ASSERT_OK(req->result);
  ++empty_closedir_cb_count;
  uv_fs_req_cleanup(req);
}